

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.cpp
# Opt level: O3

void __thiscall
Imf_3_4::TypedDeepImageChannel<float>::initializeSampleLists(TypedDeepImageChannel<float> *this)

{
  ImageLevel *pIVar1;
  long lVar2;
  _func_int **pp_Var3;
  Vec2<int> VVar4;
  size_t sVar5;
  float *pfVar6;
  ulong uVar7;
  size_t sVar8;
  
  if (this->_sampleBuffer != (float *)0x0) {
    operator_delete__(this->_sampleBuffer);
  }
  this->_sampleBuffer = (float *)0x0;
  pIVar1 = (this->super_DeepImageChannel).super_ImageChannel._level;
  lVar2 = *(long *)&pIVar1[3]._xLevelNumber;
  pp_Var3 = pIVar1[4]._vptr_ImageLevel;
  VVar4 = pIVar1[4]._dataWindow.min;
  pfVar6 = (float *)operator_new__(-(ulong)((ulong)VVar4 >> 0x3e != 0) | (long)VVar4 << 2);
  this->_sampleBuffer = pfVar6;
  (*(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel[9])(this);
  sVar5 = (this->super_DeepImageChannel).super_ImageChannel._numPixels;
  if (sVar5 != 0) {
    sVar8 = 0;
    do {
      this->_sampleListPointers[sVar8] = this->_sampleBuffer + (long)pp_Var3[sVar8];
      uVar7 = (ulong)*(uint *)(lVar2 + sVar8 * 4);
      if (uVar7 != 0) {
        memset(this->_sampleListPointers[sVar8],0,uVar7 << 2);
      }
      sVar8 = sVar8 + 1;
    } while (sVar5 != sVar8);
  }
  return;
}

Assistant:

void
TypedDeepImageChannel<T>::initializeSampleLists ()
{
    //
    // Allocate a new set of sample lists for this channel, and
    // construct zero-filled sample lists for the pixels.
    //

    delete[] _sampleBuffer;

    _sampleBuffer = 0; // set to 0 to prevent double deletion
                       // in case of an exception

    const unsigned int* numSamples    = sampleCounts ().numSamples ();
    const size_t* sampleListPositions = sampleCounts ().sampleListPositions ();

    _sampleBuffer = new T[sampleCounts ().sampleBufferSize ()];

    resetBasePointer ();

    for (size_t i = 0; i < numPixels (); ++i)
    {
        _sampleListPointers[i] = _sampleBuffer + sampleListPositions[i];

        for (unsigned int j = 0; j < numSamples[i]; ++j)
            _sampleListPointers[i][j] = T (0);
    }
}